

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall
TS_program_map_section::extractPMTDescriptors
          (TS_program_map_section *this,uint8_t *curPos,int es_info_len)

{
  byte bVar1;
  uint8_t *puVar2;
  
  if (0 < es_info_len) {
    puVar2 = curPos + es_info_len;
    do {
      bVar1 = curPos[1];
      if (3 < bVar1 && *curPos == '\t') {
        this->casID = (uint)(ushort)(*(ushort *)(curPos + 2) << 8 | *(ushort *)(curPos + 2) >> 8);
        this->casPID = (uint)curPos[5] | (curPos[4] & 0xf) << 8;
      }
      curPos = curPos + (ulong)bVar1 + 2;
    } while (curPos < puVar2);
  }
  return;
}

Assistant:

void TS_program_map_section::extractPMTDescriptors(uint8_t* curPos, const int es_info_len)
{
    const uint8_t* end = curPos + es_info_len;
    while (curPos < end)
    {
        const auto tag = static_cast<TSDescriptorTag>(*curPos);
        const uint8_t len = curPos[1];
        curPos += 2;
        if (tag == TSDescriptorTag::CAS && len >= 4)
        {
            casID = (curPos[0] << 8) + curPos[1];
            casPID = ((curPos[2] & 0x0f) << 8) + curPos[3];
        }
        curPos += len;
    }
}